

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O3

void __thiscall QNetworkAccessCache::releaseEntry(QNetworkAccessCache *this,QByteArray *key)

{
  int *piVar1;
  Node *pNVar2;
  Node<QByteArray,_QNetworkAccessCache::Node_*> *pNVar3;
  
  if (((*(Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> **)(this + 0x10) ==
        (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0) ||
      (pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::
                findNode<QByteArray>
                          (*(Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> **)
                            (this + 0x10),key),
      pNVar3 == (Node<QByteArray,_QNetworkAccessCache::Node_*> *)0x0)) ||
     (pNVar2 = pNVar3->value, pNVar2 == (Node *)0x0)) {
    releaseEntry((QNetworkAccessCache *)key);
    return;
  }
  piVar1 = &pNVar2->useCount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (pNVar2->object->expires == true) {
    linkEntry(this,key);
  }
  if (*(Node **)(this + 0x18) != pNVar2) {
    return;
  }
  updateTimer(this);
  return;
}

Assistant:

void QNetworkAccessCache::releaseEntry(const QByteArray &key)
{
    Node *node = hash.value(key);
    if (!node) {
        qWarning("QNetworkAccessCache::releaseEntry: trying to release key '%s' that is not in cache", key.constData());
        return;
    }

    Q_ASSERT(node->useCount > 0);

    if (!--node->useCount) {
        // no objects waiting; add it back to the expiry list
        if (node->object->expires)
            linkEntry(key);

        if (firstExpiringNode == node)
            updateTimer();
    }
}